

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall Highs::writeInfo(Highs *this,string *filename)

{
  HighsLogOptions *log_options_;
  bool bVar1;
  HighsStatus HVar2;
  HighsStatus call_status;
  allocator local_156;
  allocator local_155;
  HighsFileType file_type;
  string local_150;
  FILE *file;
  string local_128;
  string local_108;
  HighsLogOptions local_e8;
  HighsLogOptions local_88;
  
  log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
  HighsLogOptions::HighsLogOptions(&local_88,log_options_);
  std::__cxx11::string::string((string *)&local_108,(string *)filename);
  std::__cxx11::string::string((string *)&local_128,"writeInfo",&local_156);
  HVar2 = openWriteFile(this,&local_108,&local_128,&file,&file_type);
  std::__cxx11::string::string((string *)&local_150,"openWriteFile",&local_155);
  HVar2 = interpretCallStatus(&local_88,HVar2,kOk,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::_Function_base::~_Function_base(&local_88.user_callback.super__Function_base);
  if (HVar2 == kError) {
    HVar2 = kError;
  }
  else {
    bVar1 = std::operator!=(filename,"");
    if (bVar1) {
      highsLogUser(log_options_,kInfo,"Writing the info values to %s\n",(filename->_M_dataplus)._M_p
                  );
    }
    HighsLogOptions::HighsLogOptions(&local_e8,log_options_);
    call_status = writeInfoToFile(file,(this->info_).super_HighsInfoStruct.valid,
                                  &(this->info_).records,file_type);
    std::__cxx11::string::string((string *)&local_150,"writeInfoToFile",&local_156);
    HVar2 = interpretCallStatus(&local_e8,call_status,HVar2,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::_Function_base::~_Function_base(&local_e8.user_callback.super__Function_base);
    if (file != _stdout) {
      fclose((FILE *)file);
    }
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::writeInfo(const std::string& filename) const {
  HighsStatus return_status = HighsStatus::kOk;
  FILE* file;
  HighsFileType file_type;
  return_status =
      interpretCallStatus(options_.log_options,
                          openWriteFile(filename, "writeInfo", file, file_type),
                          return_status, "openWriteFile");
  if (return_status == HighsStatus::kError) return return_status;
  // Report to user that options are being written to a file
  if (filename != "")
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the info values to %s\n", filename.c_str());
  return_status = interpretCallStatus(
      options_.log_options,
      writeInfoToFile(file, info_.valid, info_.records, file_type),
      return_status, "writeInfoToFile");
  if (file != stdout) fclose(file);
  return return_status;
}